

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int remove_directory(mg_serve_http_opts *opts,char *dir)

{
  int iVar1;
  DIR *__dirp;
  DIR *dirp;
  cs_stat_t st;
  dirent *dp;
  char path [500];
  char *dir_local;
  mg_serve_http_opts *opts_local;
  
  unique0x100000fa = dir;
  __dirp = opendir(dir);
  if (__dirp == (DIR *)0x0) {
    opts_local._4_4_ = 0;
  }
  else {
    while (st.__glibc_reserved[2] = (__syscall_slong_t)readdir64(__dirp),
          (dirent64 *)st.__glibc_reserved[2] != (dirent64 *)0x0) {
      iVar1 = is_file_hidden(((dirent64 *)st.__glibc_reserved[2])->d_name,opts);
      if (iVar1 == 0) {
        snprintf((char *)&dp,500,"%s%c%s",stack0xffffffffffffffe0,0x2f,st.__glibc_reserved[2] + 0x13
                );
        mg_stat((char *)&dp,(cs_stat_t *)&dirp);
        if (((uint)st.st_nlink & 0xf000) == 0x4000) {
          remove_directory(opts,(char *)&dp);
        }
        else {
          remove((char *)&dp);
        }
      }
    }
    closedir(__dirp);
    rmdir(stack0xffffffffffffffe0);
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

static int remove_directory(const struct mg_serve_http_opts *opts,
                            const char *dir) {
    char path[MAX_PATH_SIZE];
    struct dirent *dp;
    cs_stat_t st;
    DIR *dirp;

    if ((dirp = opendir(dir)) == NULL) return 0;

    while ((dp = readdir(dirp)) != NULL) {
        if (is_file_hidden((const char *) dp->d_name, opts)) {
            continue;
        }
        snprintf(path, sizeof(path), "%s%c%s", dir, '/', dp->d_name);
        mg_stat(path, &st);
        if (S_ISDIR(st.st_mode)) {
            remove_directory(opts, path);
        } else {
            remove(path);
        }
    }
    closedir(dirp);
    rmdir(dir);

    return 1;
}